

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O2

bool __thiscall irr::scene::CB3DMeshFileLoader::readChunkBRUS(CB3DMeshFileLoader *this)

{
  undefined1 *puVar1;
  uint uVar2;
  long lVar3;
  pointer pSVar4;
  pointer pSVar5;
  SB3dTexture *pSVar6;
  SB3dTexture *pSVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  SColor SVar11;
  undefined4 extraout_var;
  ushort uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  u32 uVar16;
  pointer pSVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  u32 n_texs;
  array<irr::scene::SB3dMaterial> *local_150;
  string name;
  s32 texture_id;
  undefined4 uStack_124;
  undefined8 uStack_120;
  
  (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&n_texs,4);
  uVar14 = 4;
  if (n_texs < 4) {
    uVar14 = (ulong)n_texs;
  }
  uVar13 = (uint)uVar14;
  iVar8 = n_texs - uVar13;
  if (n_texs < uVar13) {
    iVar8 = 0;
  }
  local_150 = &this->Materials;
  uVar18 = (ulong)(uVar13 - 1);
  do {
    lVar3 = *(long *)&(this->super_IMeshLoader).field_0x10;
    iVar10 = *(int *)(lVar3 + -0xc);
    lVar3 = *(long *)(lVar3 + -8);
    iVar9 = (*this->B3DFile->_vptr_IReadFile[3])();
    if (iVar10 + lVar3 <= CONCAT44(extraout_var,iVar9)) {
      core::array<irr::scene::SB3dChunk>::erase
                ((array<irr::scene::SB3dChunk> *)&(this->super_IMeshLoader).field_0x8,
                 (int)((ulong)(*(long *)&(this->super_IMeshLoader).field_0x10 -
                              *(long *)&(this->super_IMeshLoader).field_0x8) >> 4) - 1);
      return true;
    }
    readString_abi_cxx11_(&name,this);
    SB3dMaterial::SB3dMaterial((SB3dMaterial *)&texture_id);
    core::array<irr::scene::SB3dMaterial>::push_back(local_150,(SB3dMaterial *)&texture_id);
    video::SMaterial::~SMaterial((SMaterial *)&texture_id);
    pSVar4 = (this->Materials).m_data.
             super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].red,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].green,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].blue,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].alpha,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].shininess,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].blend,4);
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].fx,4);
    for (uVar19 = 0; iVar10 = iVar8, uVar14 != uVar19; uVar19 = uVar19 + 1) {
      _texture_id = (ITexture *)CONCAT44(uStack_124,0xffffffff);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,(SB3dMaterial *)&texture_id,4);
      pSVar5 = (this->Textures).m_data.
               super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar17 = pSVar5 + ((ulong)_texture_id & 0xffffffff);
      if ((uint)((ulong)((long)(this->Textures).m_data.
                               super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5) >> 6) <=
          (uint)texture_id) {
        pSVar17 = (pointer)0x0;
      }
      *(pointer *)((long)((pSVar4->Material).TextureLayers + -1) + uVar19 * 8) = pSVar17;
    }
    while (iVar9 = iVar10 + -1, iVar10 != 0) {
      _texture_id = (ITexture *)CONCAT44(uStack_124,0xffffffff);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,(SB3dMaterial *)&texture_id,4);
      iVar10 = iVar9;
      if (((this->ShowWarning == true) && (texture_id != -1)) && (4 < n_texs)) {
        (*this->B3DFile->_vptr_IReadFile[4])();
        os::Printer::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        this->ShowWarning = false;
      }
    }
    pSVar6 = pSVar4[-1].Textures[0];
    uVar19 = uVar18;
    uVar15 = uVar14;
    if ((pSVar6 != (SB3dTexture *)0x0) &&
       (uVar19 = (ulong)(uVar13 - 1), (pSVar6->Flags & 0x10000) != 0)) {
      pSVar7 = pSVar4[-1].Textures[1];
      pSVar4[-1].Textures[1] = pSVar6;
      pSVar4[-1].Textures[0] = pSVar7;
      uVar19 = uVar18;
    }
    while (iVar10 = (int)uVar15, uVar15 = (ulong)(iVar10 - 1), iVar10 != 0) {
      iVar10 = (int)uVar19;
      for (; uVar19 < uVar18; uVar19 = uVar19 + 1) {
        lVar3 = *(long *)((long)(pSVar4->Material).TextureLayers + uVar19 * 8 + -0x18);
        if ((lVar3 != 0) &&
           (*(long *)((long)((pSVar4->Material).TextureLayers + -1) + uVar19 * 8) == 0)) {
          *(long *)((long)((pSVar4->Material).TextureLayers + -1) + uVar19 * 8) = lVar3;
          *(undefined8 *)((long)(pSVar4->Material).TextureLayers + uVar19 * 8 + -0x18) = 0;
        }
      }
      uVar19 = (ulong)(iVar10 - 1);
    }
    if (pSVar4[-1].Textures[1] == (SB3dTexture *)0x0) {
      if (pSVar4[-1].Textures[0] == (SB3dTexture *)0x0) {
LAB_001d5bc9:
        if (((float)pSVar4[-1].alpha != 1.0) || (NAN((float)pSVar4[-1].alpha))) goto LAB_001d5b2f;
        pSVar4[-1].Material.MaterialType = EMT_SOLID;
      }
      else {
        uVar2 = pSVar4[-1].Textures[0]->Flags;
        if ((uVar2 & 2) != 0) {
          pSVar4[-1].Material.MaterialType = EMT_TRANSPARENT_ALPHA_CHANNEL;
          goto LAB_001d5b36;
        }
        if ((uVar2 & 4) == 0) goto LAB_001d5bc9;
        pSVar4[-1].Material.MaterialType = EMT_TRANSPARENT_ALPHA_CHANNEL_REF;
      }
    }
    else {
LAB_001d5b2f:
      pSVar4[-1].Material.MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
LAB_001d5b36:
      puVar1 = &pSVar4[-1].Material.field_0xb0;
      *puVar1 = *puVar1 & 0xcf;
    }
    _texture_id = *(ITexture **)&pSVar4[-1].red;
    uStack_120._0_4_ = pSVar4[-1].blue;
    uStack_120._4_4_ = (E_TEXTURE_MIN_FILTER)pSVar4[-1].alpha;
    SVar11 = video::SColorf::toSColor((SColorf *)&texture_id);
    pSVar4[-1].Material.DiffuseColor.color = SVar11.color;
    uVar12 = *(ushort *)&pSVar4[-1].Material.field_0xa2 & 0xff8f;
    *(ushort *)&pSVar4[-1].Material.field_0xa2 = uVar12;
    uVar2 = pSVar4[-1].fx;
    if ((uVar2 & 1) == 0) {
      uVar16 = pSVar4[-1].Material.DiffuseColor.color;
    }
    else {
      puVar1 = &pSVar4[-1].Material.field_0xb0;
      *puVar1 = *puVar1 & 0xf7;
      uVar16 = 0xffffffff;
    }
    pSVar4[-1].Material.AmbientColor.color = uVar16;
    if ((uVar2 & 2) != 0) {
      *(ushort *)&pSVar4[-1].Material.field_0xa2 = uVar12 | 0x50;
    }
    if ((uVar2 & 4) != 0) {
      puVar1 = &pSVar4[-1].Material.field_0xb0;
      *puVar1 = *puVar1 & 0xfb;
    }
    if ((uVar2 & 0x10) != 0) {
      puVar1 = &pSVar4[-1].Material.field_0xb0;
      *puVar1 = *puVar1 & 0xbf;
    }
    if ((uVar2 & 0x20) != 0) {
      pSVar4[-1].Material.MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
      puVar1 = &pSVar4[-1].Material.field_0xb0;
      *puVar1 = *puVar1 & 0xcf;
    }
    pSVar4[-1].Material.Shininess = pSVar4[-1].shininess;
    ::std::__cxx11::string::_M_dispose();
  } while( true );
}

Assistant:

bool CB3DMeshFileLoader::readChunkBRUS()
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkBRUS";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	u32 n_texs;
	B3DFile->read(&n_texs, sizeof(u32));
#ifdef __BIG_ENDIAN__
	n_texs = os::Byteswap::byteswap(n_texs);
#endif

	// number of texture ids read for Irrlicht
	const u32 num_textures = core::min_(n_texs, video::MATERIAL_MAX_TEXTURES);
	// number of bytes to skip (for ignored texture ids)
	const u32 n_texs_offset = (num_textures < n_texs) ? (n_texs - num_textures) : 0;

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
	{
		// This is what blitz basic calls a brush, like a Irrlicht Material

		auto name = readString();
#ifdef _B3D_READER_DEBUG
		os::Printer::log("read Material", name.c_str(), ELL_DEBUG);
#endif
		Materials.push_back(SB3dMaterial());
		SB3dMaterial &B3dMaterial = Materials.getLast();

		readFloats(&B3dMaterial.red, 1);
		readFloats(&B3dMaterial.green, 1);
		readFloats(&B3dMaterial.blue, 1);
		readFloats(&B3dMaterial.alpha, 1);
		readFloats(&B3dMaterial.shininess, 1);

		B3DFile->read(&B3dMaterial.blend, sizeof(B3dMaterial.blend));
		B3DFile->read(&B3dMaterial.fx, sizeof(B3dMaterial.fx));
#ifdef __BIG_ENDIAN__
		B3dMaterial.blend = os::Byteswap::byteswap(B3dMaterial.blend);
		B3dMaterial.fx = os::Byteswap::byteswap(B3dMaterial.fx);
#endif
#ifdef _B3D_READER_DEBUG
		os::Printer::log("Blend", core::stringc(B3dMaterial.blend).c_str(), ELL_DEBUG);
		os::Printer::log("FX", core::stringc(B3dMaterial.fx).c_str(), ELL_DEBUG);
#endif

		u32 i;
		for (i = 0; i < num_textures; ++i) {
			s32 texture_id = -1;
			B3DFile->read(&texture_id, sizeof(s32));
#ifdef __BIG_ENDIAN__
			texture_id = os::Byteswap::byteswap(texture_id);
#endif
			//--- Get pointers to the texture, based on the IDs ---
			if ((u32)texture_id < Textures.size()) {
				B3dMaterial.Textures[i] = &Textures[texture_id];
#ifdef _B3D_READER_DEBUG
				os::Printer::log("Layer", core::stringc(i).c_str(), ELL_DEBUG);
				os::Printer::log("using texture", Textures[texture_id].TextureName.c_str(), ELL_DEBUG);
#endif
			} else
				B3dMaterial.Textures[i] = 0;
		}
		// skip other texture ids
		for (i = 0; i < n_texs_offset; ++i) {
			s32 texture_id = -1;
			B3DFile->read(&texture_id, sizeof(s32));
#ifdef __BIG_ENDIAN__
			texture_id = os::Byteswap::byteswap(texture_id);
#endif
			if (ShowWarning && (texture_id != -1) && (n_texs > video::MATERIAL_MAX_TEXTURES)) {
				os::Printer::log("Too many textures used in one material", B3DFile->getFileName(), ELL_WARNING);
				ShowWarning = false;
			}
		}

		// Fixes problems when the lightmap is on the first texture:
		if (B3dMaterial.Textures[0] != 0) {
			if (B3dMaterial.Textures[0]->Flags & 65536) { // 65536 = secondary UV
				SB3dTexture *TmpTexture;
				TmpTexture = B3dMaterial.Textures[1];
				B3dMaterial.Textures[1] = B3dMaterial.Textures[0];
				B3dMaterial.Textures[0] = TmpTexture;
			}
		}

		// If a preceeding texture slot is empty move the others down:
		for (i = num_textures; i > 0; --i) {
			for (u32 j = i - 1; j < num_textures - 1; ++j) {
				if (B3dMaterial.Textures[j + 1] != 0 && B3dMaterial.Textures[j] == 0) {
					B3dMaterial.Textures[j] = B3dMaterial.Textures[j + 1];
					B3dMaterial.Textures[j + 1] = 0;
				}
			}
		}

		//------ Convert blitz flags/blend to irrlicht -------

		// Two textures:
		if (B3dMaterial.Textures[1]) {
			B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
			B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
		} else if (B3dMaterial.Textures[0]) { // One texture:
			// Flags & 0x1 is usual SOLID, 0x8 is mipmap (handled before)
			if (B3dMaterial.Textures[0]->Flags & 0x2) { // (Alpha mapped)
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_ALPHA_CHANNEL;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			} else if (B3dMaterial.Textures[0]->Flags & 0x4)                                  //(Masked)
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_ALPHA_CHANNEL_REF; // TODO: create color key texture
			else if (B3dMaterial.alpha == 1.f)
				B3dMaterial.Material.MaterialType = video::EMT_SOLID;
			else {
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			}
		} else // No texture:
		{
			if (B3dMaterial.alpha == 1.f)
				B3dMaterial.Material.MaterialType = video::EMT_SOLID;
			else {
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			}
		}

		B3dMaterial.Material.DiffuseColor = video::SColorf(B3dMaterial.red, B3dMaterial.green, B3dMaterial.blue, B3dMaterial.alpha).toSColor();
		B3dMaterial.Material.ColorMaterial = video::ECM_NONE;

		//------ Material fx ------

		if (B3dMaterial.fx & 1) { // full-bright
			B3dMaterial.Material.AmbientColor = video::SColor(255, 255, 255, 255);
			B3dMaterial.Material.Lighting = false;
		} else
			B3dMaterial.Material.AmbientColor = B3dMaterial.Material.DiffuseColor;

		if (B3dMaterial.fx & 2) // use vertex colors instead of brush color
			B3dMaterial.Material.ColorMaterial = video::ECM_DIFFUSE_AND_AMBIENT;

		if (B3dMaterial.fx & 4) // flatshaded
			B3dMaterial.Material.GouraudShading = false;

		if (B3dMaterial.fx & 16) // disable backface culling
			B3dMaterial.Material.BackfaceCulling = false;

		if (B3dMaterial.fx & 32) { // force vertex alpha-blending
			B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
			B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
		}

		B3dMaterial.Material.Shininess = B3dMaterial.shininess;
	}

	B3dStack.erase(B3dStack.size() - 1);

	return true;
}